

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void Update2Pixels_SSE2(__m128i *pi,__m128i *qi,__m128i *a0_lo,__m128i *a0_hi)

{
  uint uVar1;
  uint uVar2;
  longlong lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i alVar6;
  
  auVar4 = psraw((undefined1  [16])*a0_lo,7);
  auVar5 = psraw((undefined1  [16])*a0_hi,7);
  auVar4 = packsswb(auVar4,auVar5);
  alVar6 = (__m128i)paddsb((undefined1  [16])*pi,auVar4);
  *pi = alVar6;
  alVar6 = (__m128i)psubsb((undefined1  [16])*qi,auVar4);
  *qi = alVar6;
  uVar1 = *(uint *)((long)*pi + 4);
  lVar3 = (*pi)[1];
  uVar2 = *(uint *)((long)*pi + 0xc);
  *(uint *)*pi = (uint)(*pi)[0] ^ 0x80808080;
  *(uint *)((long)*pi + 4) = uVar1 ^ 0x80808080;
  *(uint *)(*pi + 1) = (uint)lVar3 ^ 0x80808080;
  *(uint *)((long)*pi + 0xc) = uVar2 ^ 0x80808080;
  uVar1 = *(uint *)((long)*qi + 4);
  lVar3 = (*qi)[1];
  uVar2 = *(uint *)((long)*qi + 0xc);
  *(uint *)*qi = (uint)(*qi)[0] ^ 0x80808080;
  *(uint *)((long)*qi + 4) = uVar1 ^ 0x80808080;
  *(uint *)(*qi + 1) = (uint)lVar3 ^ 0x80808080;
  *(uint *)((long)*qi + 0xc) = uVar2 ^ 0x80808080;
  return;
}

Assistant:

static WEBP_INLINE void Update2Pixels_SSE2(__m128i* const pi, __m128i* const qi,
                                           const __m128i* const a0_lo,
                                           const __m128i* const a0_hi) {
  const __m128i a1_lo = _mm_srai_epi16(*a0_lo, 7);
  const __m128i a1_hi = _mm_srai_epi16(*a0_hi, 7);
  const __m128i delta = _mm_packs_epi16(a1_lo, a1_hi);
  const __m128i sign_bit = _mm_set1_epi8((char)0x80);
  *pi = _mm_adds_epi8(*pi, delta);
  *qi = _mm_subs_epi8(*qi, delta);
  FLIP_SIGN_BIT2(*pi, *qi);
}